

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateFieldAccessorTableInitializer
          (ImmutableMessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *field_00;
  FieldGeneratorInfo *pFVar2;
  OneofDescriptor *oneof_00;
  OneofGeneratorInfo *pOVar3;
  Descriptor *in_RDX;
  OneofGeneratorInfo *info_1;
  OneofDescriptor *oneof;
  int i_1;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  int i;
  string local_60;
  string local_40;
  int local_1c;
  Printer *pPStack_18;
  int bytecode_estimate;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_1c = 10;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_40,(java *)(this->super_MessageGenerator).descriptor_,in_RDX);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(printer,
                     "internal_$identifier$_fieldAccessorTable = new\n  com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable(\n    internal_$identifier$_descriptor,\n    new java.lang.String[] { "
                     ,"identifier",&local_40,"ver",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  field._0_4_ = 0;
  while( true ) {
    iVar1 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar1 <= (int)field) break;
    field_00 = Descriptor::field((this->super_MessageGenerator).descriptor_,(int)field);
    pFVar2 = Context::GetFieldGeneratorInfo(this->context_,field_00);
    local_1c = local_1c + 6;
    io::Printer::Print(pPStack_18,"\"$field_name$\", ","field_name",&pFVar2->capitalized_name);
    field._0_4_ = (int)field + 1;
  }
  oneof._4_4_ = 0;
  while( true ) {
    iVar1 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_);
    if (iVar1 <= oneof._4_4_) break;
    oneof_00 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,oneof._4_4_);
    pOVar3 = Context::GetOneofGeneratorInfo(this->context_,oneof_00);
    local_1c = local_1c + 6;
    io::Printer::Print(pPStack_18,"\"$oneof_name$\", ","oneof_name",&pOVar3->capitalized_name);
    oneof._4_4_ = oneof._4_4_ + 1;
  }
  io::Printer::Print(pPStack_18,"});\n");
  return local_1c;
}

Assistant:

int ImmutableMessageGenerator::
GenerateFieldAccessorTableInitializer(io::Printer* printer) {
  int bytecode_estimate = 10;
  printer->Print(
    "internal_$identifier$_fieldAccessorTable = new\n"
    "  com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable(\n"
    "    internal_$identifier$_descriptor,\n"
    "    new java.lang.String[] { ",
    "identifier", UniqueFileScopeIdentifier(descriptor_),
    "ver", GeneratedCodeVersionSuffix());
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    bytecode_estimate += 6;
    printer->Print(
      "\"$field_name$\", ",
      "field_name", info->capitalized_name);
  }
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    const OneofGeneratorInfo* info = context_->GetOneofGeneratorInfo(oneof);
    bytecode_estimate += 6;
    printer->Print(
      "\"$oneof_name$\", ",
      "oneof_name", info->capitalized_name);
  }
  printer->Print("});\n");
  return bytecode_estimate;
}